

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenstream.cpp
# Opt level: O1

void __thiscall
embree::TokenStream::TokenStream
          (TokenStream *this,Ref<embree::Stream<int>_> *cin,string *alpha,string *seps,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *symbols)

{
  Stream<int> *pSVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  allocator_type local_31;
  
  (this->super_Stream<embree::Token>).super_RefCount.refCounter.super___atomic_base<unsigned_long>.
  _M_i = 0;
  (this->super_Stream<embree::Token>).super_RefCount._vptr_RefCount =
       (_func_int **)&PTR__Stream_002cc3d8;
  (this->super_Stream<embree::Token>).start = 0;
  (this->super_Stream<embree::Token>).past = 0;
  (this->super_Stream<embree::Token>).future = 0;
  std::
  vector<std::pair<embree::Token,_embree::ParseLocation>,_std::allocator<std::pair<embree::Token,_embree::ParseLocation>_>_>
  ::vector(&(this->super_Stream<embree::Token>).buffer,0x400,&local_31);
  (this->super_Stream<embree::Token>).super_RefCount._vptr_RefCount =
       (_func_int **)&PTR__TokenStream_002cc368;
  pSVar1 = cin->ptr;
  (this->cin).ptr = pSVar1;
  if (pSVar1 != (Stream<int> *)0x0) {
    (*(pSVar1->super_RefCount)._vptr_RefCount[2])();
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->symbols,symbols);
  memset(this->isAlphaMap,0,0x100);
  if (alpha->_M_string_length != 0) {
    uVar4 = 0;
    do {
      this->isAlphaMap[(byte)(alpha->_M_dataplus)._M_p[uVar4]] = true;
      uVar4 = uVar4 + 1;
    } while (uVar4 < alpha->_M_string_length);
  }
  memset(this->isSepMap,0,0x100);
  if (seps->_M_string_length != 0) {
    uVar4 = 0;
    do {
      this->isSepMap[(byte)(seps->_M_dataplus)._M_p[uVar4]] = true;
      uVar4 = uVar4 + 1;
    } while (uVar4 < seps->_M_string_length);
  }
  memset(this->isStringCharMap,0,0x100);
  lVar3 = DAT_002cef28;
  lVar2 = stringChars_abi_cxx11_;
  if (DAT_002cef28 != 0) {
    lVar5 = 0;
    do {
      this->isStringCharMap[*(byte *)(lVar2 + lVar5)] = true;
      lVar5 = lVar5 + 1;
    } while (lVar3 != lVar5);
  }
  return;
}

Assistant:

TokenStream::TokenStream(const Ref<Stream<int> >& cin,            //< stream to read from
                                   const std::string& alpha,                //< valid characters for identifiers
                                   const std::string& seps,                 //< characters that act as separators
                                   const std::vector<std::string>& symbols) //< symbols
    : cin(cin), symbols(symbols)
  {
    createCharMap(isAlphaMap,alpha);
    createCharMap(isSepMap,seps);
    createCharMap(isStringCharMap,stringChars);
  }